

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O1

vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> * __thiscall
wasm::DataFlow::UseFinder::getUses
          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__return_storage_ptr__,
          UseFinder *this,Expression *origin,Graph *graph,LocalGraph *localGraph)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  LocalSet *pLVar3;
  LocalSet *set;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = debug();
  if (1 < iVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"getUses\n",8);
    poVar2 = std::ostream::_M_insert<void_const*>(&std::cout);
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
  }
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar3 = (LocalSet *)Graph::getParent(graph,origin);
  set = (LocalSet *)0x0;
  if ((pLVar3 != (LocalSet *)0x0) &&
     ((pLVar3->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id == LocalSetId
     )) {
    set = pLVar3;
  }
  if (set != (LocalSet *)0x0) {
    addSetUses(this,set,graph,localGraph,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Expression*>
  getUses(Expression* origin, Graph& graph, LocalGraph& localGraph) {
    if (debug() >= 2) {
      std::cout << "getUses\n" << origin << '\n';
    }
    std::vector<Expression*> ret;
    auto* set = graph.getSet(origin);
    if (!set) {
      // If the parent is not a set (a drop, call, return, etc.) then
      // it is not something we need to track.
      return ret;
    }
    addSetUses(set, graph, localGraph, ret);
    return ret;
  }